

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::throwLogicError(string *message,SourceLineInfo *locationInfo)

{
  ostream *poVar1;
  logic_error *this;
  ostringstream local_1b8 [8];
  ostringstream oss;
  string local_40 [32];
  
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  operator<<((ostream *)local_1b8,locationInfo);
  poVar1 = std::operator<<((ostream *)local_1b8,": Internal Catch error: \'");
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::operator<<(poVar1,"\'");
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::logic_error::logic_error(this,local_40);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void throwLogicError( std::string const& message, SourceLineInfo const& locationInfo ) {
        std::ostringstream oss;
        oss << locationInfo << ": Internal Catch error: '" << message << "'";
        if( alwaysTrue() )
            throw std::logic_error( oss.str() );
    }